

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O0

int CVodeGetLastStep(void *cvode_mem,sunrealtype *hlast)

{
  undefined8 *in_RSI;
  long in_RDI;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x5c6,"CVodeGetLastStep",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x810);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeGetLastStep(void* cvode_mem, sunrealtype* hlast)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  *hlast = cv_mem->cv_hu;

  return (CV_SUCCESS);
}